

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

parser<pstore::exchange::import_ns::callbacks> * __thiscall
pstore::json::parser<pstore::exchange::import_ns::callbacks>::input
          (parser<pstore::exchange::import_ns::callbacks> *this,string *src)

{
  pointer pcVar1;
  parser<pstore::exchange::import_ns::callbacks> *ppVar2;
  span<const_char,__1L> local_28;
  
  pcVar1 = (src->_M_dataplus)._M_p;
  gsl::details::extent_type<-1L>::extent_type((extent_type<_1L> *)&local_28,src->_M_string_length);
  local_28.storage_.data_ = pcVar1;
  ppVar2 = input<pstore::gsl::span<char_const,_1l>>(this,&local_28);
  return ppVar2;
}

Assistant:

parser & input (std::string const & src) { return this->input (gsl::make_span (src)); }